

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
PluginManagerTest_DoSomething_Test::PluginManagerTest_DoSomething_Test
          (PluginManagerTest_DoSomething_Test *this)

{
  PluginManagerTest_DoSomething_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PluginManagerTest_DoSomething_Test_00196988;
  return;
}

Assistant:

TEST( PluginManagerTest, DoSomething )
{
	const char* plugins[] = { "pluginA", "pluginB" };

	float values[2] = { 0.0f, 0.0f };
	size_t i{ 0 };

	for ( const auto pluginFilename : plugins )
	{
		if ( IPlugin* plugin = IPluginManager::Get()->loadPlugin( pluginFilename ) )
		{
			if ( ICustomPlugin* customPlugin = dynamic_cast<ICustomPlugin*>( plugin ) )
			{
				customPlugin->sayHelloTo( "Agustin" );
				values[i++] = customPlugin->doSomething( 4, 5 );
			}
			else
			{
				std::cout << "Plugin does not implement ICustomPlugin." << std::endl;
			}
			IPluginManager::Get()->unloadPlugin( pluginFilename );
		}
	}

	EXPECT_EQ( 9, values[0] );
	EXPECT_EQ( 0, values[1] );
}